

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

void __thiscall TestHarness::AddType(TestHarness *this,int type,int weight,char *name)

{
  size_type *psVar1;
  undefined1 local_58 [8];
  Type t;
  
  psVar1 = &t.name._M_string_length;
  t.name._M_dataplus._M_p = (pointer)0x0;
  t.name._M_string_length._0_1_ = 0;
  local_58 = (undefined1  [8])psVar1;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)local_58,0,(char *)0x0,(ulong)name);
  t.name.field_2._8_4_ = type;
  t.name.field_2._12_4_ = weight;
  std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::push_back
            (&this->types_,(value_type *)local_58);
  this->total_weight_ = this->total_weight_ + weight;
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58,
                    CONCAT71(t.name._M_string_length._1_7_,(undefined1)t.name._M_string_length) + 1)
    ;
  }
  return;
}

Assistant:

void TestHarness::AddType(int type, int weight, const char* name) {
  Type t;
  t.name = name;
  t.type = type;
  t.weight = weight;
  types_.push_back(t);
  total_weight_ += weight;
}